

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pages.c
# Opt level: O1

_Bool pages_commit_impl(void *addr,size_t size,_Bool commit)

{
  void *addr_00;
  _Bool _Var1;
  
  _Var1 = true;
  if (!os_overcommits) {
    addr_00 = mmap(addr,size,(uint)commit * 3,mmap_flags | 0x10,-1,0);
    if (addr_00 != (void *)0xffffffffffffffff) {
      if (addr_00 == addr) {
        _Var1 = false;
      }
      else {
        os_pages_unmap(addr_00,size);
      }
    }
  }
  return _Var1;
}

Assistant:

static bool
pages_commit_impl(void *addr, size_t size, bool commit) {
	if (os_overcommits) {
		return true;
	}

	return os_pages_commit(addr, size, commit);
}